

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi_display_driver.cpp
# Opt level: O0

void __thiscall AnsiDisplayDriver::display(AnsiDisplayDriver *this,Document *doc,ostream *output)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  long local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ulong local_68;
  size_t j;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  ulong local_48;
  size_t i;
  AnsiWrapper wrapper;
  CodeLineElement *code_le;
  LineElement *l;
  Paragraph *p;
  ostream *output_local;
  Document *doc_local;
  AnsiDisplayDriver *this_local;
  
  _wrapper = 0;
  AnsiWrapper::AnsiWrapper((AnsiWrapper *)&i,output);
  for (local_48 = 0; uVar1 = local_48, uVar3 = Document::size(), uVar1 < uVar3;
      local_48 = local_48 + 1) {
    plVar4 = (long *)Document::operator[]((ulong)doc);
    uVar2 = (**(code **)(*plVar4 + 8))();
    switch(uVar2) {
    case 1:
      local_4c = 4;
      AnsiWrapper::fg((Color *)&i);
      AnsiWrapper::underline(SUB81(&i,0));
      break;
    case 2:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [3])0x197ce0);
      local_50 = 4;
      AnsiWrapper::fg((Color *)&i);
      break;
    case 3:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [5])0x197cde);
      local_54 = 4;
      AnsiWrapper::fg((Color *)&i);
      break;
    default:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [5])0x197cde);
      break;
    case 8:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [5])0x197cde);
      j._4_4_ = 6;
      AnsiWrapper::fg((Color *)&i);
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [3])0x197872);
      AnsiWrapper::reset();
      break;
    case 9:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [7])"      ");
      j._0_4_ = 6;
      AnsiWrapper::fg((Color *)&i);
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [3])0x197872);
      AnsiWrapper::reset();
      break;
    case 10:
      AnsiWrapper::operator<<((AnsiWrapper *)&i,(char (*) [5])0x197cde);
      local_58 = 4;
      AnsiWrapper::fg((Color *)&i);
      AnsiWrapper::reverse();
    }
    for (local_68 = 0; uVar1 = local_68, uVar3 = Paragraph::size(), uVar1 < uVar3;
        local_68 = local_68 + 1) {
      plVar5 = (long *)Paragraph::operator[]((ulong)plVar4);
      if (plVar5 == (long *)0x0) {
        local_c0 = 0;
      }
      else {
        local_c0 = __dynamic_cast(plVar5,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
      }
      _wrapper = local_c0;
      if (local_c0 != 0) {
        AnsiWrapper::reverse();
      }
      (**(code **)(*plVar5 + 0x10))();
      AnsiWrapper::operator<<((AnsiWrapper *)&i,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      AnsiWrapper::reset();
    }
    AnsiWrapper::reset();
    AnsiWrapper::operator<<((AnsiWrapper *)&i,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void AnsiDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);

	AnsiWrapper wrapper(output);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];
		switch (p->level()) {
			case Paragraph::Level::Title1:
				wrapper.fg(Color::Blue);
				wrapper.underline();
				break;
			case Paragraph::Level::Title2:
				wrapper << "  ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Title3:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				break;
			case Paragraph::Level::Quote:
				wrapper << "    ";
				wrapper.fg(Color::Blue);
				wrapper.reverse();
				break;
			case Paragraph::Level::UList1:
				wrapper << "    ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			case Paragraph::Level::UList2:
				wrapper << "      ";
				wrapper.fg(Color::Cyan);
				wrapper << "* ";
				wrapper.reset();
				break;
			default:
				wrapper << "    ";
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			code_le = dynamic_cast<CodeLineElement*>(l);

			if (code_le) {
				wrapper.reverse();
			}

			wrapper << l->content();
			
			wrapper.reset();

		}
		wrapper.reset();
		wrapper << endl;
	}
}